

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError AlsaOpen(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *params,
                StreamDirection streamDir,snd_pcm_t **pcm)

{
  int __pa_unsure_error_id;
  int iVar1;
  int iVar2;
  PaDeviceInfo *pPVar3;
  pthread_t __thread1;
  char *errorText;
  PaError PVar4;
  char *format;
  
  if (params->hostApiSpecificStreamInfo == (void *)0x0) {
    pPVar3 = hostApi->deviceInfos[params->device] + 1;
  }
  else {
    pPVar3 = (PaDeviceInfo *)((long)params->hostApiSpecificStreamInfo + 0x18);
  }
  iVar1 = OpenPcm(pcm,*(char **)pPVar3,(uint)(streamDir == StreamDirection_In),1,1);
  if (iVar1 < 0) {
    *pcm = (snd_pcm_t *)0x0;
    PVar4 = (uint)(iVar1 == -0x10) * 8 + -0x2709;
    format = 
    "Expression \'ret\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1801\n"
    ;
  }
  else {
    iVar1 = snd_pcm_nonblock(*pcm,0);
    if (-1 < iVar1) {
      return 0;
    }
    __thread1 = pthread_self();
    iVar2 = pthread_equal(__thread1,paUnixMainThread);
    PVar4 = -9999;
    format = 
    "Expression \'alsa_snd_pcm_nonblock( *pcm, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1803\n"
    ;
    if (iVar2 != 0) {
      errorText = (char *)snd_strerror(iVar1);
      PaUtil_SetLastHostErrorInfo(paALSA,(long)iVar1,errorText);
    }
  }
  PaUtil_DebugPrint(format);
  return PVar4;
}

Assistant:

static PaError AlsaOpen( const PaUtilHostApiRepresentation *hostApi, const PaStreamParameters *params, StreamDirection
        streamDir, snd_pcm_t **pcm )
{
    PaError result = paNoError;
    int ret;
    const char* deviceName = "";
    const PaAlsaDeviceInfo *deviceInfo = NULL;
    PaAlsaStreamInfo *streamInfo = (PaAlsaStreamInfo *)params->hostApiSpecificStreamInfo;

    if( !streamInfo )
    {
        deviceInfo = GetDeviceInfo( hostApi, params->device );
        deviceName = deviceInfo->alsaName;
    }
    else
        deviceName = streamInfo->deviceString;

    PA_DEBUG(( "%s: Opening device %s\n", __FUNCTION__, deviceName ));
    if( (ret = OpenPcm( pcm, deviceName, streamDir == StreamDirection_In ? SND_PCM_STREAM_CAPTURE : SND_PCM_STREAM_PLAYBACK,
                    SND_PCM_NONBLOCK, 1 )) < 0 )
    {
        /* Not to be closed */
        *pcm = NULL;
        ENSURE_( ret, -EBUSY == ret ? paDeviceUnavailable : paBadIODeviceCombination );
    }
    ENSURE_( alsa_snd_pcm_nonblock( *pcm, 0 ), paUnanticipatedHostError );

end:
    return result;

error:
    goto end;
}